

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void Test_Strerror_logging::RunTest(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  string *psVar5;
  ostream *poVar6;
  char **v1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2;
  int err;
  CheckOpString local_170;
  LogMessage local_168;
  string local_158;
  string *local_138;
  _Check_string *_result_8;
  CheckOpString local_120;
  CheckOpString _result_7;
  LogMessage local_110;
  string *local_100;
  _Check_string *_result_6;
  CheckOpString local_e8;
  CheckOpString _result_5;
  LogMessage local_d8;
  string *local_c8;
  _Check_string *_result_4;
  LogMessage local_b8;
  string *local_a8;
  _Check_string *_result_3;
  LogMessage local_98;
  char local_82;
  char local_81;
  string *local_80;
  _Check_string *_result_2;
  LogMessage local_70;
  string *local_60;
  _Check_string *_result_1;
  CheckOpString local_48;
  LogMessage local_40;
  string *local_30;
  _Check_string *_result;
  char *buf;
  size_t buf_size;
  char *msg;
  int errcode;
  
  msg._4_4_ = 4;
  __s = strerror(4);
  buf_size = (size_t)strdup(__s);
  sVar4 = strlen((char *)buf_size);
  buf = (char *)(sVar4 + 1);
  _result = (_Check_string *)operator_new__((size_t)buf);
  iVar2 = google::posix_strerror_r(msg._4_4_,(char *)0x0,0);
  iVar2 = google::GetReferenceableValue(iVar2);
  iVar3 = google::GetReferenceableValue(-1);
  local_30 = google::Check_EQImpl_abi_cxx11_
                       (iVar2,iVar3,"posix_strerror_r(errcode, __null, 0) == -1");
  if (local_30 != (string *)0x0) {
    google::CheckOpString::CheckOpString(&local_48,local_30);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x421,&local_48);
    google::LogMessage::stream(&local_40);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
  }
  _result->_M_dataplus = (_Alloc_hider)0x41;
  iVar2 = google::posix_strerror_r(msg._4_4_,(char *)_result,0);
  iVar2 = google::GetReferenceableValue(iVar2);
  iVar3 = google::GetReferenceableValue(-1);
  local_60 = google::Check_EQImpl_abi_cxx11_(iVar2,iVar3,"posix_strerror_r(errcode, buf, 0) == -1");
  if (local_60 != (string *)0x0) {
    google::CheckOpString::CheckOpString((CheckOpString *)&_result_2,local_60);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x423,(CheckOpString *)&_result_2);
    google::LogMessage::stream(&local_70);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_70);
  }
  local_81 = google::GetReferenceableValue((char)_result->_M_dataplus);
  local_82 = google::GetReferenceableValue('A');
  local_80 = google::Check_EQImpl<char,char>(&local_81,&local_82,"buf[0] == \'A\'");
  if (local_80 != (string *)0x0) {
    google::CheckOpString::CheckOpString((CheckOpString *)&_result_3,local_80);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x424,(CheckOpString *)&_result_3);
    google::LogMessage::stream(&local_98);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_98);
  }
  iVar2 = google::posix_strerror_r(msg._4_4_,(char *)0x0,(size_t)buf);
  iVar2 = google::GetReferenceableValue(iVar2);
  iVar3 = google::GetReferenceableValue(-1);
  local_a8 = google::Check_EQImpl_abi_cxx11_
                       (iVar2,iVar3,"posix_strerror_r(errcode, __null, buf_size) == -1");
  if (local_a8 != (string *)0x0) {
    google::CheckOpString::CheckOpString((CheckOpString *)&_result_4,local_a8);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x425,(CheckOpString *)&_result_4);
    google::LogMessage::stream(&local_b8);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_b8);
  }
  iVar2 = google::posix_strerror_r(msg._4_4_,(char *)_result,1);
  iVar2 = google::GetReferenceableValue(iVar2);
  iVar3 = google::GetReferenceableValue(0);
  local_c8 = google::Check_EQImpl_abi_cxx11_(iVar2,iVar3,"posix_strerror_r(errcode, buf, 1) == 0");
  if (local_c8 != (string *)0x0) {
    google::CheckOpString::CheckOpString(&_result_5,local_c8);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x42b,&_result_5);
    google::LogMessage::stream(&local_d8);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_d8);
  }
  psVar5 = google::CheckstrcmptrueImpl_abi_cxx11_((char *)_result,"","buf == \"\"");
  google::CheckOpString::CheckOpString(&local_e8,psVar5);
  bVar1 = google::CheckOpString::operator_cast_to_bool(&local_e8);
  if (bVar1) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&_result_6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x42d);
    poVar6 = google::LogMessage::stream((LogMessage *)&_result_6);
    std::operator<<(poVar6,(string *)local_e8.str_);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&_result_6);
  }
  iVar2 = google::posix_strerror_r(msg._4_4_,(char *)_result,(size_t)buf);
  iVar2 = google::GetReferenceableValue(iVar2);
  iVar3 = google::GetReferenceableValue(0);
  local_100 = google::Check_EQImpl_abi_cxx11_
                        (iVar2,iVar3,"posix_strerror_r(errcode, buf, buf_size) == 0");
  if (local_100 != (string *)0x0) {
    google::CheckOpString::CheckOpString(&_result_7,local_100);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x42e,&_result_7);
    google::LogMessage::stream(&local_110);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_110);
  }
  psVar5 = google::CheckstrcmptrueImpl_abi_cxx11_((char *)_result,(char *)buf_size,"buf == msg");
  google::CheckOpString::CheckOpString(&local_120,psVar5);
  bVar1 = google::CheckOpString::operator_cast_to_bool(&local_120);
  if (!bVar1) {
    if (_result != (_Check_string *)0x0) {
      operator_delete__(_result);
    }
    v1 = google::GetReferenceableValue<char*>((char **)&buf_size);
    google::StrError_abi_cxx11_(&local_158,(google *)(ulong)msg._4_4_,err);
    v2 = google::GetReferenceableValue<std::__cxx11::string>(&local_158);
    psVar5 = google::Check_EQImpl<char*,std::__cxx11::string>(v1,v2,"msg == StrError(errcode)");
    std::__cxx11::string::~string((string *)&local_158);
    local_138 = psVar5;
    if (psVar5 != (string *)0x0) {
      google::CheckOpString::CheckOpString(&local_170,psVar5);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_168,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x431,&local_170);
      google::LogMessage::stream(&local_168);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_168);
    }
    free((void *)buf_size);
    return;
  }
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&_result_8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x42f);
  poVar6 = google::LogMessage::stream((LogMessage *)&_result_8);
  std::operator<<(poVar6,(string *)local_120.str_);
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&_result_8);
}

Assistant:

TEST(Strerror, logging) {
  int errcode = EINTR;
  char *msg = strdup(strerror(errcode));
  const size_t buf_size = strlen(msg) + 1;
  char *buf = new char[buf_size];
  CHECK_EQ(posix_strerror_r(errcode, NULL, 0), -1);
  buf[0] = 'A';
  CHECK_EQ(posix_strerror_r(errcode, buf, 0), -1);
  CHECK_EQ(buf[0], 'A');
  CHECK_EQ(posix_strerror_r(errcode, NULL, buf_size), -1);
#if defined(OS_MACOSX) || defined(OS_FREEBSD) || defined(OS_OPENBSD)
  // MacOSX or FreeBSD considers this case is an error since there is
  // no enough space.
  CHECK_EQ(posix_strerror_r(errcode, buf, 1), -1);
#else
  CHECK_EQ(posix_strerror_r(errcode, buf, 1), 0);
#endif
  CHECK_STREQ(buf, "");
  CHECK_EQ(posix_strerror_r(errcode, buf, buf_size), 0);
  CHECK_STREQ(buf, msg);
  delete[] buf;
  CHECK_EQ(msg, StrError(errcode));
  free(msg);
}